

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NFmap.c
# Opt level: O0

NF_link_map * NF_map(NF_list *nl,int mode,void *addr)

{
  ushort uVar1;
  int fd;
  long lVar2;
  Elf64_Addr aEStack_a0 [3];
  size_t asStack_88 [2];
  undefined1 auStack_78 [32];
  size_t maplength;
  loadcmd *c;
  Elf64_Phdr *ph;
  _Bool has_holes;
  ulong uStack_40;
  int nloadcmds;
  unsigned_long __vla_expr0;
  loadcmd *local_30;
  Elf64_Phdr *phdr;
  NF_link_map *l;
  void *addr_local;
  NF_list *pNStack_10;
  int mode_local;
  NF_list *nl_local;
  
  phdr = (Elf64_Phdr *)nl->map;
  asStack_88[1] = 0x104b0b;
  l = (NF_link_map *)addr;
  addr_local._4_4_ = mode;
  pNStack_10 = nl;
  local_30 = (loadcmd *)malloc(((NF_link_map *)phdr)->l_phlen);
  asStack_88[1] = 0x104b2b;
  pread(pNStack_10->fd,local_30,phdr[1].p_offset,phdr[1].p_vaddr);
  uVar1 = (ushort)phdr[1].p_type;
  uStack_40 = (ulong)uVar1;
  lVar2 = -(ulong)((uint)uVar1 * 0x30);
  auStack_78._16_8_ = auStack_78 + lVar2;
  ph._4_4_ = 0;
  ph._3_1_ = false;
  for (c = local_30; c < (loadcmd *)((long)local_30 + (ulong)(ushort)phdr[1].p_type * 0x38);
      c = (loadcmd *)&c[1].mapend) {
    auStack_78._12_4_ = (undefined4)c->mapstart;
    if (auStack_78._12_4_ == 1) {
      maplength = auStack_78._16_8_ + (long)ph._4_4_ * 0x30;
      ((loadcmd *)maplength)->mapstart = c->dataend & 0xfffffffffffff000;
      ((loadcmd *)maplength)->mapend = c->dataend + c->mapoff + 0xfff & 0xfffffffffffff000;
      ((loadcmd *)maplength)->dataend = c->dataend + c->mapoff;
      ((loadcmd *)maplength)->allocend = c->dataend + *(long *)&c->prot;
      ((loadcmd *)maplength)->mapoff = c->mapend & 0xfffffffffffff000;
      if ((1 < ph._4_4_ + 1) &&
         (((loadcmd *)(maplength + -0x30))->mapend != ((loadcmd *)maplength)->mapstart)) {
        ph._3_1_ = true;
      }
      ((loadcmd *)maplength)->prot = 0;
      ((loadcmd *)maplength)->prot =
           (*(uint *)((long)&c->mapstart + 4) & 4) >> 2 | ((loadcmd *)maplength)->prot;
      ((loadcmd *)maplength)->prot =
           *(uint *)((long)&c->mapstart + 4) & 2 | ((loadcmd *)maplength)->prot;
      ((loadcmd *)maplength)->prot =
           (*(uint *)((long)&c->mapstart + 4) & 1) << 2 | ((loadcmd *)maplength)->prot;
      ph._4_4_ = ph._4_4_ + 1;
    }
    else if (auStack_78._12_4_ == 2) {
      phdr->p_vaddr = c->dataend;
      *(short *)((long)&phdr[1].p_type + 2) = (short)(*(ulong *)&c->prot >> 4);
    }
    else if (auStack_78._12_4_ == 6) {
      phdr[1].p_paddr = c->dataend;
    }
  }
  auStack_78._24_8_ =
       ((loadcmd *)(auStack_78._16_8_ + (long)(ph._4_4_ + -1) * 0x30))->allocend -
       ((loadcmd *)auStack_78._16_8_)->mapstart;
  fd = pNStack_10->fd;
  *(undefined8 *)((long)asStack_88 + lVar2) = auStack_78._24_8_;
  *(undefined8 *)((long)aEStack_a0 + lVar2 + 0x10) = 0x104d68;
  __vla_expr0 = (unsigned_long)auStack_78;
  map_segments((NF_link_map *)phdr,l,(loadcmd *)auStack_78._16_8_,ph._4_4_,(_Bool)ph._3_1_,fd,
               *(size_t *)((long)asStack_88 + lVar2));
  if (phdr[1].p_paddr == 0) {
    phdr[1].p_paddr = (Elf64_Addr)local_30;
  }
  phdr[1].p_paddr = phdr[1].p_paddr + *(long *)phdr;
  phdr->p_vaddr = phdr->p_vaddr + *(long *)phdr;
  *(undefined8 *)(auStack_78 + lVar2 + -8) = 0x104dba;
  fill_info((NF_link_map *)phdr);
  *(undefined8 *)(auStack_78 + lVar2 + -8) = 0x104dc3;
  setup_hash((NF_link_map *)phdr);
  return (NF_link_map *)phdr;
}

Assistant:

struct NF_link_map *NF_map(struct NF_list *nl, int mode, void *addr)
{
    //int fd;

    /* TODO: actually serach directories here */
    //fd = open(file, O_RDONLY, 0);
    /* it may help to know the SONAME and REALNAME of a so */

    //struct filebuf fb;

    /* just cram into buf as much as you can */
    /* use a do-while can assure this event won't be interrupted */
    //size_t retlen = read(fd, fb.buf, sizeof(fb.buf) - fb.len);

    /* the information we get from ehdr is merely phnum, total length of all program headers, and offset for program headers
     * so we dump filebuf in NF_list, instead it is added as NF_link_map members
     * also ``Elf64_Addr`` is always sufficient for ``maplength``, for it is a memory length
     */
    //Elf64_Ehdr *ehdr = (Elf64_Ehdr *)nl->fb.buf;
    //size_t maplength = ehdr->e_phnum * sizeof(Elf64_Phdr);

    /* create a new link map, and fill in header table info */
    //struct NF_link_map *l = calloc(sizeof(struct NF_link_map), 1);
    //l->l_phnum = ehdr->e_phnum;

    /* note that in dl-load: open_verify 
     * That function open an file with a little bit check to the phdrs
     * And the same thing just appear once again in _dl_map_object_from_fd
     */
    /* store the phdrs on heap for further loading */
    //Elf64_Phdr *phdr = malloc(maplength);
    //pread(nl->fd, (void *)phdr, maplength, ehdr->e_phoff);

    struct NF_link_map *l = nl->map;
    Elf64_Phdr *phdr = malloc(l->l_phlen);
    pread(nl->fd, (void *)phdr, l->l_phlen, l->l_phoff);

    struct loadcmd loadcmds[l->l_phnum];
    int nloadcmds = 0;
    bool has_holes = false;

    Elf64_Phdr *ph;
    /* travese the segments! */
    for (ph = phdr; ph < &phdr[l->l_phnum]; ++ph)
    {
        switch (ph->p_type)
        {
        case PT_LOAD:
        {
            /* load and add it to loadcmds */
            struct loadcmd *c = &loadcmds[nloadcmds++]; //get the current loaction in loadcmds
            /* TODO: pagesize are set to 4096 for simplicity */
            c->mapstart = ALIGN_DOWN(ph->p_vaddr, 4096);
            c->mapend = ALIGN_UP(ph->p_vaddr + ph->p_filesz, 4096);
            c->dataend = ph->p_vaddr + ph->p_filesz;
            c->allocend = ph->p_vaddr + ph->p_memsz;
            c->mapoff = ALIGN_DOWN(ph->p_offset, 4096);

            /* hey ELF, is it your last segment? */
            if (nloadcmds > 1 && c[-1].mapend != c->mapstart)
                has_holes = true;

            /* setting the protection of this segment. may have errors */
            c->prot = 0;
            c->prot |= (ph->p_flags & PF_R) >> 2;
            c->prot |= ph->p_flags & PF_W;
            c->prot |= (ph->p_flags & PF_X) << 2;

            break;
        }
        case PT_PHDR:
            /* the PHT itself, usually the first one */
            /* or it may not exist at all, in which case it says "use ld.so to find it in a LOAD segment" */
            l->l_phdr = (void *)ph->p_vaddr;
            break;

        case PT_DYNAMIC:
            /* the dynamic section */
            l->l_ld = (void *)ph->p_vaddr;
            l->l_ldnum = ph->p_memsz / sizeof(Elf64_Dyn);
            break;

        default:
            break;
        }
    }

    /* now map LOAD segments into memory */
    size_t maplength = loadcmds[nloadcmds - 1].allocend - loadcmds[0].mapstart;
    map_segments(l, addr, loadcmds, nloadcmds, has_holes, nl->fd, maplength);

    if (l->l_phdr == NULL)
        /* This is expected. I don't know why l_phdr is not allocated 
     * It's probably because of capatiabilty issue, sigh
     */
        l->l_phdr = phdr;

    /* After loading, the absolute address is set, now relocate the PHT */
    l->l_phdr = (Elf64_Phdr *)((Elf64_Addr)l->l_phdr + l->l_addr);

    /* rebasing ld to prevent SIGSEGV */
    l->l_ld = (Elf64_Dyn *)((Elf64_Addr)l->l_ld + l->l_addr);
    /* indexing the l_ld into l_info */
    fill_info(l);

    setup_hash(l);

    return l;
}